

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O3

bool cfgfile::format_t<bool,_cfgfile::string_trait_t>::from_string
               (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  size_t __n;
  __type _Var1;
  int iVar2;
  exception_t<cfgfile::string_trait_t> *this;
  pos_t pos;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = value->_M_string_length;
  if (__n == _DAT_00130fa0) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((value->_M_dataplus)._M_p,const_t<cfgfile::string_trait_t>::c_on_abi_cxx11_,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if (__n == DAT_00130ea8) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((value->_M_dataplus)._M_p,const_t<cfgfile::string_trait_t>::c_true_abi_cxx11_,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if (__n == DAT_00130fc8) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((value->_M_dataplus)._M_p,const_t<cfgfile::string_trait_t>::c_1_abi_cxx11_,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if (__n == DAT_00130ff0) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((value->_M_dataplus)._M_p,const_t<cfgfile::string_trait_t>::c_yes_abi_cxx11_,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if ((((__n != DAT_00131018) ||
       ((__n != 0 &&
        (iVar2 = bcmp((value->_M_dataplus)._M_p,const_t<cfgfile::string_trait_t>::c_off_abi_cxx11_,
                      __n), iVar2 != 0)))) &&
      ((__n != DAT_00130ed0 ||
       ((__n != 0 &&
        (iVar2 = bcmp((value->_M_dataplus)._M_p,const_t<cfgfile::string_trait_t>::c_false_abi_cxx11_
                      ,__n), iVar2 != 0)))))) &&
     ((_Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)const_t<cfgfile::string_trait_t>::c_0_abi_cxx11_), !_Var1 &&
      (_Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)const_t<cfgfile::string_trait_t>::c_no_abi_cxx11_), !_Var1))
     )) {
    this = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Invalid value: \"","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_210,local_210 + local_208);
    std::operator+(&local_f0,&local_130,value);
    local_170 = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\". In file \"","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_170,local_170 + local_168);
    std::operator+(&local_d0,&local_f0,&local_150);
    std::operator+(&local_b0,&local_d0,&info->m_file_name);
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\" on line ","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_1d0,local_1d0 + local_1c8);
    std::operator+(&local_90,&local_b0,&local_190);
    string_trait_t::to_string_abi_cxx11_(&local_110,(string_trait_t *)info->m_line_number,pos);
    std::operator+(&local_70,&local_90,&local_110);
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,local_1f0,local_1f0 + local_1e8);
    std::operator+(&local_50,&local_70,&local_1b0);
    exception_t<cfgfile::string_trait_t>::exception_t(this,&local_50);
    __cxa_throw(this,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  return false;
}

Assistant:

static bool from_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & value )
	{
		if( value == const_t< Trait >::c_on ||
			value == const_t< Trait >::c_true ||
			value == const_t< Trait >::c_1 ||
			value == const_t< Trait >::c_yes )
				return true;
		else if( value == const_t< Trait >::c_off ||
			value == const_t< Trait >::c_false ||
			value == const_t< Trait >::c_0 ||
			value == const_t< Trait >::c_no )
				return false;
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Invalid value: \"" ) +
				value + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}